

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Checkbox(char *label,bool *v)

{
  float *this;
  ImDrawList *this_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id_00;
  ImU32 fill_col;
  ImGuiWindow *this_01;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  char *local_140;
  ImGuiCol local_104;
  float local_ec;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 local_cc;
  float local_c4;
  ImVec2 IStack_c0;
  float pad_1;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 pad;
  ImU32 check_col;
  ImVec2 local_94;
  ImVec2 local_8c;
  undefined1 local_84 [8];
  ImRect check_bb;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_68;
  undefined1 local_60 [8];
  ImRect total_bb;
  ImVec2 pos;
  float square_sz;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  bool *v_local;
  char *label_local;
  
  this_01 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((this_01->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this_01,label,(char *)0x0);
    IVar5 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar3 = GetFrameHeight();
    total_bb.Max = (this_01->DC).CursorPos;
    pos.y = IVar5.x;
    if (pos.y <= 0.0) {
      local_ec = 0.0;
    }
    else {
      local_ec = (pIVar1->Style).ItemInnerSpacing.x + pos.y;
    }
    square_sz = IVar5.y;
    fVar4 = (pIVar1->Style).FramePadding.y;
    this = &check_bb.Max.y;
    ImVec2::ImVec2((ImVec2 *)this,fVar3 + local_ec,fVar4 + fVar4 + square_sz);
    local_68 = ::operator+(&total_bb.Max,(ImVec2 *)this);
    ImRect::ImRect((ImRect *)local_60,&total_bb.Max,&local_68);
    ItemSize((ImRect *)local_60,(pIVar1->Style).FramePadding.y);
    bVar2 = ItemAdd((ImRect *)local_60,id_00,(ImRect *)0x0);
    if (bVar2) {
      check_bb.Max.x._1_1_ =
           ButtonBehavior((ImRect *)local_60,id_00,(bool *)((long)&check_bb.Max.x + 3),
                          (bool *)((long)&check_bb.Max.x + 2),0);
      if ((bool)check_bb.Max.x._1_1_) {
        *v = (bool)((*v ^ 0xffU) & 1);
        MarkItemEdited(id_00);
      }
      ImVec2::ImVec2(&local_94,fVar3,fVar3);
      local_8c = ::operator+(&total_bb.Max,&local_94);
      ImRect::ImRect((ImRect *)local_84,&total_bb.Max,&local_8c);
      RenderNavHighlight((ImRect *)local_60,id_00,1);
      IVar5.y = (float)local_84._4_4_;
      IVar5.x = (float)local_84._0_4_;
      unique0x10000271 = check_bb.Min.y;
      pad.y = check_bb.Min.x;
      if (((check_bb.Max.x._2_1_ & 1) == 0) || ((check_bb.Max.x._3_1_ & 1) == 0)) {
        local_104 = 7;
        if ((check_bb.Max.x._3_1_ & 1) != 0) {
          local_104 = 8;
        }
      }
      else {
        local_104 = 9;
      }
      fill_col = GetColorU32(local_104,1.0);
      RenderFrame(IVar5,stack0xffffffffffffff5c,fill_col,true,(pIVar1->Style).FrameRounding);
      pad.x = (float)GetColorU32(0x12,1.0);
      if (((this_01->DC).ItemFlags & 0x40U) == 0) {
        if ((*v & 1U) != 0) {
          local_c4 = ImMax<float>(1.0,(float)(int)(fVar3 / 6.0));
          ImVec2::ImVec2(&local_d4,local_c4,local_c4);
          local_cc = ::operator+((ImVec2 *)local_84,&local_d4);
          RenderCheckMark(local_cc,(ImU32)pad.x,fVar3 - (local_c4 + local_c4));
        }
      }
      else {
        fVar4 = ImMax<float>(1.0,(float)(int)(fVar3 / 3.6));
        fVar3 = ImMax<float>(1.0,(float)(int)(fVar3 / 3.6));
        ImVec2::ImVec2(&local_b0,fVar4,fVar3);
        this_00 = this_01->DrawList;
        local_b8 = ::operator+((ImVec2 *)local_84,&local_b0);
        IStack_c0 = ::operator-(&check_bb.Min,&local_b0);
        ImDrawList::AddRectFilled
                  (this_00,&local_b8,&stack0xffffffffffffff40,(ImU32)pad.x,
                   (pIVar1->Style).FrameRounding,0xf);
      }
      if ((pIVar1->LogEnabled & 1U) != 0) {
        if ((*v & 1U) == 0) {
          local_140 = "[ ]";
        }
        else {
          local_140 = "[x]";
        }
        LogRenderedText((ImVec2 *)local_60,local_140,(char *)0x0);
      }
      if (0.0 < pos.y) {
        ImVec2::ImVec2(&local_dc,check_bb.Min.x + (pIVar1->Style).ItemInnerSpacing.x,
                       (float)local_84._4_4_ + (pIVar1->Style).FramePadding.y);
        RenderText(local_dc,label,(char *)0x0,true);
      }
      label_local._7_1_ = (bool)(check_bb.Max.x._1_1_ & 1);
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::Checkbox(const char* label, bool* v)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const float square_sz = GetFrameHeight();
    const ImVec2 pos = window->DC.CursorPos;
    const ImRect total_bb(pos, pos + ImVec2(square_sz + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), label_size.y + style.FramePadding.y * 2.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
    {
        *v = !(*v);
        MarkItemEdited(id);
    }

    const ImRect check_bb(pos, pos + ImVec2(square_sz, square_sz));
    RenderNavHighlight(total_bb, id);
    RenderFrame(check_bb.Min, check_bb.Max, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), true, style.FrameRounding);
    ImU32 check_col = GetColorU32(ImGuiCol_CheckMark);
    if (window->DC.ItemFlags & ImGuiItemFlags_MixedValue)
    {
        // Undocumented tristate/mixed/indeterminate checkbox (#2644)
        ImVec2 pad(ImMax(1.0f, (float)(int)(square_sz / 3.6f)), ImMax(1.0f, (float)(int)(square_sz / 3.6f)));
        window->DrawList->AddRectFilled(check_bb.Min + pad, check_bb.Max - pad, check_col, style.FrameRounding);
    }
    else if (*v)
    {
        const float pad = ImMax(1.0f, (float)(int)(square_sz / 6.0f));
        RenderCheckMark(check_bb.Min + ImVec2(pad, pad), check_col, square_sz - pad*2.0f);
    }

    if (g.LogEnabled)
        LogRenderedText(&total_bb.Min, *v ? "[x]" : "[ ]");
    if (label_size.x > 0.0f)
        RenderText(ImVec2(check_bb.Max.x + style.ItemInnerSpacing.x, check_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Checkable | (*v ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}